

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamEuler::ComputeGravityForces
          (ChElementBeamEuler *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  Index IVar1;
  Index index;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  double *pdVar5;
  ChVectorDynamic<> mG;
  ChMatrixDynamic<> mM;
  assign_op<double,_double> local_99;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  DenseStorage<double,__1,__1,__1,_1> local_88;
  double *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_40;
  
  local_88.m_data = (double *)0x0;
  local_88.m_rows = 0;
  local_88.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_88,0x90,0xc,0xc);
  local_50 = 0;
  local_68 = local_88.m_data;
  local_60 = local_88.m_rows;
  local_58 = local_88.m_cols;
  if ((local_88.m_rows | local_88.m_cols) < 0 && local_88.m_data != (double *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                 );
  }
  local_50 = local_88.m_cols;
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[7])
            (this);
  local_98.m_storage.m_data = (double *)0x0;
  local_98.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,0xc);
  IVar1 = local_98.m_storage.m_rows;
  pdVar5 = local_98.m_storage.m_data;
  if (local_98.m_storage.m_rows < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (local_98.m_storage.m_rows == 0) goto LAB_00662536;
  memset(local_98.m_storage.m_data,0,local_98.m_storage.m_rows * 8);
  if ((ulong)IVar1 < 3) goto LAB_00662536;
  uVar2 = 3;
  if (((ulong)pdVar5 & 7) == 0) {
    uVar3 = -((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar3 < 3) {
      uVar2 = (ulong)uVar3;
    }
    if (uVar3 != 0) goto LAB_00662445;
  }
  else {
LAB_00662445:
    uVar4 = 0;
    do {
      pdVar5[uVar4] = G_acc->m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  if (uVar2 < 3) {
    do {
      pdVar5[uVar2] = G_acc->m_data[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar2 != 3);
  }
  if (IVar1 < 9) {
LAB_00662536:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar5 = pdVar5 + 6;
  uVar2 = 3;
  if (((ulong)pdVar5 & 7) == 0) {
    uVar3 = -((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar3 < 3) {
      uVar2 = (ulong)uVar3;
    }
    if (uVar3 == 0) goto LAB_006624bf;
  }
  uVar4 = 0;
  do {
    pdVar5[uVar4] = G_acc->m_data[uVar4];
    uVar4 = uVar4 + 1;
  } while (uVar2 != uVar4);
LAB_006624bf:
  if (uVar2 < 3) {
    do {
      pdVar5[uVar2] = G_acc->m_data[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar2 != 3);
  }
  if (local_88.m_cols == IVar1) {
    local_40.m_lhs = (LhsNested)&local_88;
    local_40.m_rhs = (RhsNested)&local_98;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
              (Fg,&local_40,&local_99,(type)0x0);
    if (local_98.m_storage.m_data != (double *)0x0) {
      free((void *)local_98.m_storage.m_data[-1]);
    }
    if (local_88.m_data != (double *)0x0) {
      free((void *)local_88.m_data[-1]);
    }
    return;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
               );
}

Assistant:

void ChElementBeamEuler::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    
    // no so efficient... a temporary mass matrix here:
    ChMatrixDynamic<> mM(12, 12);
    this->ComputeMmatrixGlobal(mM);

    // a vector of G accelerations for the two nodes (for translation degrees of freedom)
    ChVectorDynamic<> mG(12);
    mG.setZero();
    mG.segment(0, 3) = G_acc.eigen();
    mG.segment(6, 3) = G_acc.eigen();

    // Gravity forces as M*g, always works, regardless of the way M 
    // is computed (lumped or consistent, with offset center of mass or centered, etc.)
    // [Maybe one can replace this function with a faster ad-hoc implementation in case of lumped masses.]
    Fg = mM * mG;

    //// TODO for the lumped mass matrix case, the mM * mG product can be unrolled into few multiplications as mM mostly zero, and same for mG
}